

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

Suite * suite_create(char *name)

{
  Suite *pSVar1;
  char *pcVar2;
  List *pLVar3;
  
  pSVar1 = (Suite *)emalloc(0x10);
  pcVar2 = "";
  if (name != (char *)0x0) {
    pcVar2 = name;
  }
  pSVar1->name = pcVar2;
  pLVar3 = check_list_create();
  pSVar1->tclst = pLVar3;
  return pSVar1;
}

Assistant:

Suite *suite_create(const char *name)
{
    Suite *s;

    s = (Suite *)emalloc(sizeof(Suite)); /* freed in suite_free */
    if(name == NULL)
        s->name = "";
    else
        s->name = name;
    s->tclst = check_list_create();
    return s;
}